

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O2

CommImplMPI * __thiscall
adios2::helper::CommImplMPI::Win_allocate_shared
          (CommImplMPI *this,size_t size,int disp_unit,void *baseptr,string *hint)

{
  int value;
  long *plVar1;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  plVar1 = (long *)operator_new(0x10);
  *plVar1 = (long)&PTR__CommWinImplMPI_0016e818;
  value = MPI_Win_allocate_shared
                    (CONCAT44(in_register_00000014,disp_unit),(ulong)baseptr & 0xffffffff,
                     &ompi_mpi_info_null,*(undefined8 *)(size + 8),hint,plVar1 + 1);
  std::operator+(&local_70,"in call to Win_allocate_shared ",in_R9);
  std::operator+(&local_50,&local_70,"\n");
  anon_unknown_1::CheckMPIReturn(value,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  adios2::helper::CommImpl::MakeWin(this);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  return this;
}

Assistant:

Comm::Win CommImplMPI::Win_allocate_shared(size_t size, int disp_unit, void *baseptr,
                                           const std::string &hint) const
{
    auto w = std::unique_ptr<CommWinImplMPI>(new CommWinImplMPI());
    MPI_Aint asize = static_cast<MPI_Aint>(size);
    CheckMPIReturn(
        MPI_Win_allocate_shared(asize, disp_unit, MPI_INFO_NULL, m_MPIComm, baseptr, &w->m_Win),
        "in call to Win_allocate_shared " + hint + "\n");
    return MakeWin(std::move(w));
}